

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_pad_reflect_1d(ggml_compute_params *params,ggml_tensor *dst)

{
  long lVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  ggml_tensor *pgVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  void *pvVar13;
  long lVar14;
  ulong uVar15;
  undefined4 *puVar16;
  char *pcVar17;
  long lVar18;
  undefined4 *puVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  undefined8 uVar23;
  long lVar24;
  long lVar25;
  undefined4 *puVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  
  pgVar5 = dst->src[0];
  if (pgVar5->type == GGML_TYPE_F32) {
    if (dst->type == GGML_TYPE_F32) {
      lVar6 = dst->ne[3];
      if (0 < lVar6) {
        lVar29 = (long)params->nth;
        lVar24 = (long)params->ith;
        sVar7 = pgVar5->nb[2];
        iVar3 = dst->op_params[1];
        iVar4 = dst->op_params[0];
        sVar8 = pgVar5->nb[1];
        lVar9 = dst->ne[1];
        sVar10 = pgVar5->nb[3];
        uVar30 = (uint)pgVar5->ne[0];
        local_c8 = (long)iVar4 * dst->nb[0];
        lVar14 = (~(long)iVar3 + dst->ne[0]) * dst->nb[0];
        local_e0 = dst->nb[1] * lVar24;
        lVar28 = dst->nb[1] * lVar29;
        local_d0 = local_c8 + -4 + local_e0;
        local_c8 = local_c8 + local_e0;
        local_f0 = sVar8 * lVar24;
        sVar11 = dst->nb[2];
        local_d8 = lVar14 + local_e0;
        local_e0 = lVar14 + -4 + local_e0;
        lVar14 = dst->ne[2];
        lVar22 = 0;
        sVar12 = dst->nb[3];
        do {
          if (0 < lVar14) {
            lVar21 = 0;
            local_90 = local_e0;
            local_98 = local_d0;
            local_88 = local_d8;
            local_e8 = local_f0;
            local_a0 = local_c8;
            do {
              if (lVar24 < lVar9) {
                pvVar13 = dst->data;
                lVar25 = (long)pgVar5->data + local_e8;
                lVar27 = (long)pvVar13 + local_a0;
                puVar19 = (undefined4 *)((long)pvVar13 + local_98);
                puVar26 = (undefined4 *)((long)pvVar13 + local_90);
                lVar20 = (long)pvVar13 + local_88;
                lVar18 = lVar24;
                do {
                  if (0 < (int)uVar30) {
                    uVar15 = 0;
                    do {
                      *(undefined4 *)(lVar27 + uVar15 * 4) = *(undefined4 *)(lVar25 + uVar15 * 4);
                      uVar15 = uVar15 + 1;
                    } while ((uVar30 & 0x7fffffff) != uVar15);
                  }
                  if (0 < iVar4) {
                    uVar15 = 1;
                    puVar16 = puVar19;
                    do {
                      lVar1 = uVar15 * 4;
                      uVar15 = uVar15 + 1;
                      *puVar16 = *(undefined4 *)(lVar27 + lVar1);
                      puVar16 = puVar16 + -1;
                    } while (iVar4 + 1 != uVar15);
                  }
                  if (0 < iVar3) {
                    uVar15 = 1;
                    puVar16 = puVar26;
                    do {
                      uVar2 = *puVar16;
                      puVar16 = puVar16 + -1;
                      *(undefined4 *)(lVar20 + uVar15 * 4) = uVar2;
                      uVar15 = uVar15 + 1;
                    } while (iVar3 + 1 != uVar15);
                  }
                  lVar18 = lVar18 + lVar29;
                  lVar25 = lVar25 + sVar8 * lVar29;
                  lVar27 = lVar27 + lVar28;
                  puVar19 = (undefined4 *)((long)puVar19 + lVar28);
                  puVar26 = (undefined4 *)((long)puVar26 + lVar28);
                  lVar20 = lVar20 + lVar28;
                } while (lVar18 < lVar9);
              }
              local_e8 = local_e8 + sVar7;
              local_a0 = local_a0 + sVar11;
              local_98 = local_98 + sVar11;
              local_90 = local_90 + sVar11;
              local_88 = local_88 + sVar11;
              lVar21 = lVar21 + 1;
            } while (lVar21 != lVar14);
          }
          local_f0 = local_f0 + sVar10;
          local_c8 = local_c8 + sVar12;
          local_d0 = local_d0 + sVar12;
          local_e0 = local_e0 + sVar12;
          local_d8 = local_d8 + sVar12;
          lVar22 = lVar22 + 1;
        } while (lVar22 != lVar6);
      }
      return;
    }
    pcVar17 = "dst->type == GGML_TYPE_F32";
    uVar23 = 0x1a18;
  }
  else {
    pcVar17 = "src0->type == GGML_TYPE_F32";
    uVar23 = 0x1a17;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar23,"GGML_ASSERT(%s) failed",pcVar17);
}

Assistant:

void ggml_compute_forward_pad_reflect_1d(
        const ggml_compute_params * params,
              ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    GGML_ASSERT(src0->type == GGML_TYPE_F32);
    GGML_ASSERT( dst->type == GGML_TYPE_F32);

    const int ith = params->ith;
    const int nth = params->nth;

    const int32_t * opts = (const int32_t *) dst->op_params;
    const int p0 = opts[0];
    const int p1 = opts[1];

    GGML_TENSOR_UNARY_OP_LOCALS

    for (int64_t i3 = 0; i3 < ne3; i3++) {
        for (int64_t i2 = 0; i2 < ne2; i2++) {
            for (int64_t i1 = ith; i1 < ne1; i1 += nth) {
                float * left  = (float *) ((char *) dst->data + i3*nb3 + i2*nb2 + i1*nb1 +         p0*nb0);
                float * right = (float *) ((char *) dst->data + i3*nb3 + i2*nb2 + i1*nb1 + (ne0-p1-1)*nb0);

                ggml_vec_cpy_f32(ne00, left, (float *) ((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01));

                for (int i0 = 1; i0 <= p0; i0++) { left[-i0] = left[i0];   }
                for (int i0 = 1; i0 <= p1; i0++) { right[i0] = right[-i0]; }
            }
        }
    }
}